

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QDBusSignature>::insert
          (QMovableArrayOps<QDBusSignature> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QDBusSignature *pQVar5;
  long lVar6;
  qsizetype inserts;
  bool bVar7;
  
  pQVar2 = &((t->m_signature).d.d)->super_QArrayData;
  pcVar3 = (t->m_signature).d.ptr;
  qVar4 = (t->m_signature).d.size;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar7 = (this->super_QGenericArrayOps<QDBusSignature>).super_QArrayDataPointer<QDBusSignature>.
          size != 0;
  QArrayDataPointer<QDBusSignature>::detachAndGrow
            ((QArrayDataPointer<QDBusSignature> *)this,(uint)(i == 0 && bVar7),n,
             (QDBusSignature **)0x0,(QArrayDataPointer<QDBusSignature> *)0x0);
  if (i == 0 && bVar7) {
    if (n != 0) {
      pQVar5 = (this->super_QGenericArrayOps<QDBusSignature>).
               super_QArrayDataPointer<QDBusSignature>.ptr;
      do {
        pQVar5[-1].m_signature.d.d = (Data *)pQVar2;
        pQVar5[-1].m_signature.d.ptr = pcVar3;
        pQVar5[-1].m_signature.d.size = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar5 = (this->super_QGenericArrayOps<QDBusSignature>).
                   super_QArrayDataPointer<QDBusSignature>.ptr;
        }
        n = n + -1;
        pQVar5 = pQVar5 + -1;
        (this->super_QGenericArrayOps<QDBusSignature>).super_QArrayDataPointer<QDBusSignature>.ptr =
             pQVar5;
        pqVar1 = &(this->super_QGenericArrayOps<QDBusSignature>).
                  super_QArrayDataPointer<QDBusSignature>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (n != 0);
    }
  }
  else {
    pQVar5 = (this->super_QGenericArrayOps<QDBusSignature>).super_QArrayDataPointer<QDBusSignature>.
             ptr + i;
    memmove(pQVar5 + n,pQVar5,
            ((this->super_QGenericArrayOps<QDBusSignature>).super_QArrayDataPointer<QDBusSignature>.
             size - i) * 0x18);
    lVar6 = n;
    if (n != 0) {
      do {
        (pQVar5->m_signature).d.d = (Data *)pQVar2;
        (pQVar5->m_signature).d.ptr = pcVar3;
        (pQVar5->m_signature).d.size = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar6 = lVar6 + -1;
        pQVar5 = pQVar5 + 1;
      } while (lVar6 != 0);
    }
    pqVar1 = &(this->super_QGenericArrayOps<QDBusSignature>).super_QArrayDataPointer<QDBusSignature>
              .size;
    *pqVar1 = *pqVar1 + n;
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }